

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O3

int __thiscall Group::build(Group *this,int *v,int vn,int c)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  float fVar17;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_fjzzq2002[P]MiniShader_group_h:26:21)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_fjzzq2002[P]MiniShader_group_h:26:21)>
  __comp_00;
  long local_c0;
  int local_b4;
  ulong local_b0;
  int *local_a8;
  ulong local_a0;
  long local_98;
  BoundingBox local_90;
  BoundingBox local_78;
  BoundingBox local_60;
  BoundingBox local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  if (vn == 1) {
    iVar6 = *v;
  }
  else {
    lVar11 = (long)vn;
    local_a0 = (ulong)(uint)this->bn;
    this->bn = this->bn + 1;
    local_b4 = c;
    if (vn != 0) {
      __comp._M_comp.c = &local_b4;
      __comp._M_comp.this = this;
      std::
      __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Group::build(int*,int,int)::_lambda(int,int)_1_>>
                (v,v + lVar11,(ulong)(uint)((int)LZCOUNT(lVar11) * 2) ^ 0x7e,__comp);
      __comp_00._M_comp.c = &local_b4;
      __comp_00._M_comp.this = this;
      std::
      __final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Group::build(int*,int,int)::_lambda(int,int)_1_>>
                (v,v + lVar11,__comp_00);
    }
    pBVar1 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8 = v;
    local_98 = lVar11;
    Vector3f::operator=(&pBVar1->a,&BoundingBox::EMPTY.a);
    Vector3f::operator=(&pBVar1->b,&BoundingBox::EMPTY.b);
    local_b0 = (ulong)(uint)vn;
    if (0 < vn) {
      lVar12 = 0;
      lVar11 = local_b0 * 0x18;
      piVar9 = local_a8;
      do {
        iVar6 = *piVar9;
        pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar2 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::Vector3f(&local_48.a,&pBVar1[iVar6].a);
        Vector3f::Vector3f(&local_48.b,&pBVar1[iVar6].b);
        BoundingBox::operator|
                  (&local_90,(BoundingBox *)((long)(pBVar2->a).m_elements + lVar12),&local_48);
        pBVar1 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::operator=((Vector3f *)((long)pBVar1[1].a.m_elements + lVar12),&local_90.a);
        Vector3f::operator=((Vector3f *)((long)pBVar1[1].b.m_elements + lVar12),&local_90.b);
        piVar9 = piVar9 + 1;
        lVar12 = lVar12 + 0x18;
      } while (lVar11 != lVar12);
    }
    lVar11 = local_98;
    pBVar1 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    Vector3f::operator=(&pBVar1[local_98].a,&BoundingBox::EMPTY.a);
    Vector3f::operator=(&pBVar1[lVar11].b,&BoundingBox::EMPTY.b);
    if (0 < vn) {
      uVar10 = local_b0 + 1;
      lVar11 = local_b0 * 0x18;
      do {
        iVar6 = local_a8[uVar10 - 2];
        pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar2 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::Vector3f(&local_78.a,&pBVar1[iVar6].a);
        Vector3f::Vector3f(&local_78.b,&pBVar1[iVar6].b);
        BoundingBox::operator|
                  (&local_90,(BoundingBox *)((long)(pBVar2->a).m_elements + lVar11),&local_78);
        pBVar1 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::operator=((Vector3f *)((long)pBVar1[-1].a.m_elements + lVar11),&local_90.a);
        Vector3f::operator=((Vector3f *)((long)(&pBVar1->a + -1) + lVar11),&local_90.b);
        uVar10 = uVar10 - 1;
        lVar11 = lVar11 + -0x18;
      } while (1 < uVar10);
    }
    iVar6 = (int)local_a0;
    lVar11 = (long)(int)local_a0;
    iVar8 = vn / 2;
    local_c0 = (long)iVar8;
    fVar14 = BoundingBox::area((this->t1).
                               super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl
                               .super__Vector_impl_data._M_start + local_c0);
    auVar15._0_4_ =
         BoundingBox::area((this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>.
                           _M_impl.super__Vector_impl_data._M_start + local_c0);
    auVar15._4_60_ = extraout_var;
    if (1 < vn) {
      auVar4 = vmaxss_avx(auVar15._0_16_,ZEXT416((uint)fVar14));
      lVar13 = 0x18;
      iVar7 = 1;
      lVar12 = local_b0 * 0x18;
      do {
        fVar17 = auVar4._0_4_;
        fVar14 = BoundingBox::area((BoundingBox *)
                                   ((long)(((this->t1).
                                            super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->a).
                                          m_elements + lVar13));
        local_b0 = CONCAT44(local_b0._4_4_,fVar14);
        auVar16._0_4_ =
             BoundingBox::area((BoundingBox *)
                               ((long)(((this->t2).
                                        super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->a).m_elements +
                               lVar13));
        auVar16._4_60_ = extraout_var_00;
        auVar5 = vmaxss_avx(auVar16._0_16_,ZEXT416((uint)local_b0));
        auVar4 = vminss_avx(auVar5,ZEXT416((uint)fVar17));
        if (auVar5._0_4_ < fVar17) {
          iVar8 = iVar7;
        }
        lVar13 = lVar13 + 0x18;
        iVar7 = iVar7 + 1;
      } while (lVar12 != lVar13);
      local_c0 = (long)iVar8;
    }
    piVar9 = local_a8;
    iVar7 = build(this,local_a8,iVar8,local_b4 + 1 + ((local_b4 + 1) / 3) * -3);
    (this->ch).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar11 * 2] = iVar7;
    iVar8 = build(this,piVar9 + local_c0,vn - iVar8,local_b4 + 1 + ((local_b4 + 1) / 3) * -3);
    piVar3 = (this->ch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[iVar6 * 2 + 1] = iVar8;
    iVar6 = piVar3[lVar11 * 2];
    pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    Vector3f::Vector3f(&local_60.a,&pBVar1[iVar8].a);
    Vector3f::Vector3f(&local_60.b,&pBVar1[iVar8].b);
    BoundingBox::operator|(&local_90,pBVar1 + iVar6,&local_60);
    pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    Vector3f::operator=(&pBVar1[lVar11].a,&local_90.a);
    Vector3f::operator=(&pBVar1[lVar11].b,&local_90.b);
    iVar6 = (int)local_a0;
  }
  return iVar6;
}

Assistant:

int build(int* v,int vn,int c=0)
	{
//		cerr << vn << "!" << v[0] << "!!\n";
//		for (int j = 0; j < vn; ++j) cerr << v[j] << "|"; cerr << "EZ\n";
		if (vn == 1) return v[0];
		int p = bn++;
		std::sort(v,v+vn, [&](int p, int q) {return box[p].a[c] + box[p].b[c] < box[q].a[c] + box[q].b[c]; });
		t1[0] = BoundingBox::EMPTY;
		for (int i = 0; i < vn; ++i)
			t1[i+1] = t1[i] | box[v[i]];
		t2[vn] = BoundingBox::EMPTY;
		for (int i = vn - 1; i >= 0; --i)
			t2[i] = t2[i + 1] | box[v[i]];
		int I=vn/2;
		float mxx = std::max(t1[I].area(),t2[I].area());
		for (int i = 1; i < vn; ++i)
		{
			float ma = std::max(t1[i].area(), t2[i].area());
			if (ma < mxx) mxx = ma, I = i;
		}
		ch[p * 2] = build(v, I, (c+1)%3);
//		cerr << p << "FIRSTHALF ED\n";
		ch[p * 2 + 1] = build(v + I, vn - I,(c+1)%3);
		box[p] = box[ch[p * 2]] | box[ch[p * 2 + 1]];
		return p;
	}